

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void libyuv::YuvPixel16(int16_t y,int16_t u,int16_t v,int *b,int *g,int *r,
                       YuvConstants *yuvconstants)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  uint uVar8;
  int32_t iVar9;
  int32_t iVar10;
  int *in_RCX;
  short in_DX;
  short in_SI;
  short in_DI;
  int *in_R8;
  int *in_R9;
  uint32_t y1;
  int yg;
  int br;
  int bg;
  int bb;
  int vr;
  int vg;
  int ug;
  int ub;
  
  cVar1 = *_yg;
  cVar2 = _yg[0x20];
  cVar3 = _yg[0x21];
  cVar4 = _yg[0x41];
  sVar5 = *(short *)(_yg + 0x60);
  sVar6 = *(short *)(_yg + 0x80);
  sVar7 = *(short *)(_yg + 0xa0);
  uVar8 = (uint)(in_DI * 0x40 * (int)*(short *)(_yg + 0xc0)) >> 0x10;
  iVar9 = clamp255((int)in_SI >> 2);
  iVar10 = clamp255((int)in_DX >> 2);
  *in_RCX = (uVar8 - (int)(short)iVar9 * (int)cVar1) + (int)sVar5;
  *in_R8 = (uVar8 - ((int)(short)iVar9 * (int)cVar2 + (int)(short)iVar10 * (int)cVar3)) + (int)sVar6
  ;
  *in_R9 = (uVar8 - (int)(short)iVar10 * (int)cVar4) + (int)sVar7;
  return;
}

Assistant:

static __inline void YuvPixel16(int16_t y,
                                int16_t u,
                                int16_t v,
                                int* b,
                                int* g,
                                int* r,
                                const struct YuvConstants* yuvconstants) {
#if defined(__aarch64__)
  int ub = -yuvconstants->kUVToRB[0];
  int ug = yuvconstants->kUVToG[0];
  int vg = yuvconstants->kUVToG[1];
  int vr = -yuvconstants->kUVToRB[1];
  int bb = yuvconstants->kUVBiasBGR[0];
  int bg = yuvconstants->kUVBiasBGR[1];
  int br = yuvconstants->kUVBiasBGR[2];
  int yg = yuvconstants->kYToRgb[1];
#elif defined(__arm__)
  int ub = -yuvconstants->kUVToRB[0];
  int ug = yuvconstants->kUVToG[0];
  int vg = yuvconstants->kUVToG[4];
  int vr = -yuvconstants->kUVToRB[4];
  int bb = yuvconstants->kUVBiasBGR[0];
  int bg = yuvconstants->kUVBiasBGR[1];
  int br = yuvconstants->kUVBiasBGR[2];
  int yg = yuvconstants->kYToRgb[1];
#else
  int ub = yuvconstants->kUVToB[0];
  int ug = yuvconstants->kUVToG[0];
  int vg = yuvconstants->kUVToG[1];
  int vr = yuvconstants->kUVToR[1];
  int bb = yuvconstants->kUVBiasB[0];
  int bg = yuvconstants->kUVBiasG[0];
  int br = yuvconstants->kUVBiasR[0];
  int yg = yuvconstants->kYToRgb[0];
#endif

  uint32_t y1 = (uint32_t)((y << 6) * yg) >> 16;
  u = clamp255(u >> 2);
  v = clamp255(v >> 2);
  *b = (int)(-(u * ub) + y1 + bb);
  *g = (int)(-(u * ug + v * vg) + y1 + bg);
  *r = (int)(-(v * vr) + y1 + br);
}